

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Count_Heap.h
# Opt level: O1

void __thiscall Count_Heap<4U>::Init(Count_Heap<4U> *this,Data<4U> *item)

{
  void *pvVar1;
  int **ppiVar2;
  Heap<4U> *this_00;
  uint uVar3;
  int iVar4;
  void *pvVar5;
  uint8_t *data;
  ulong uVar6;
  uint32_t k1;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  
  uVar9 = (ulong)this->hash_num;
  pvVar5 = operator_new__(uVar9 * 4);
  if (uVar9 != 0) {
    ppiVar2 = this->counter;
    uVar6 = 0;
    do {
      uVar7 = (*(int *)item->str * 0x16a88000 | (uint)(*(int *)item->str * -0x3361d2af) >> 0x11) *
              0x1b873593;
      uVar3 = uVar7 ^ (uint)uVar6;
      uVar3 = (uVar3 >> 0x13 | uVar3 << 0xd) * 5 + 0xe6546b64;
      uVar3 = (uVar3 >> 0x10 ^ uVar3 ^ 4) * -0x7a143595;
      uVar3 = (uVar3 >> 0xd ^ uVar3) * -0x3d4d51cb;
      uVar9 = (ulong)(uVar3 >> 0x10 ^ uVar3) % (ulong)this->length;
      uVar7 = (uint)uVar6 + 0x65 ^ uVar7;
      uVar3 = (uVar7 >> 0x13 | uVar7 << 0xd) * 5 + 0xe6546b64;
      uVar3 = (uVar3 >> 0x10 ^ uVar3 ^ 4) * -0x7a143595;
      uVar3 = (uVar3 >> 0xd ^ uVar3) * -0x3d4d51cb;
      iVar4 = COUNT[(uVar3 >> 0x10 ^ uVar3) & 1];
      iVar8 = ppiVar2[uVar6][uVar9] + iVar4;
      ppiVar2[uVar6][uVar9] = iVar8;
      *(int *)((long)pvVar5 + uVar6 * 4) = iVar8 * iVar4;
      uVar6 = uVar6 + 1;
      uVar9 = (ulong)this->hash_num;
    } while (uVar6 < uVar9);
  }
  this_00 = this->heap;
  if ((uint)uVar9 != 0) {
    pvVar1 = (void *)((long)pvVar5 + uVar9 * 4);
    std::__introsort_loop<int*,long,__gnu_cxx::__ops::_Iter_less_iter>
              (pvVar5,pvVar1,(int)LZCOUNT(uVar9) * 2 ^ 0x7e);
    std::__final_insertion_sort<int*,__gnu_cxx::__ops::_Iter_less_iter>(pvVar5,pvVar1);
  }
  uVar3 = (uint)uVar9 >> 1;
  iVar4 = *(int *)((long)pvVar5 + (ulong)uVar3 * 4);
  if ((uVar9 & 1) == 0) {
    iVar4 = (iVar4 + *(int *)((long)pvVar5 + (ulong)(uVar3 - 1) * 4)) / 2;
  }
  Heap<4U>::Insert(this_00,item,iVar4);
  operator_delete__(pvVar5);
  return;
}

Assistant:

void Init(const Data<DATA_LEN>& item) {
		int* result = new int[hash_num];

		for (uint32_t i = 0; i < hash_num; ++i) {
			uint32_t position = item.Hash(i) % length;
			uint32_t choice = item.Hash(i + 101) & 1;
			counter[i][position] += COUNT[choice];
			result[i] = counter[i][position] * COUNT[choice];
		}

		heap->Insert(item, Get_Median(result, hash_num));
		delete[] result;
	}